

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileParser::getMaterialLib(ObjFileParser *this)

{
  IOSystem *pIVar1;
  undefined8 __beg;
  bool bVar2;
  int iVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  reference pcVar5;
  long lVar6;
  Logger *pLVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pcVar8;
  IOStream *pIVar9;
  pointer pModel;
  byte local_a29;
  undefined1 local_a20 [8];
  ObjFileMtlImporter mtlImporter;
  vector<char,_std::allocator<char>_> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator<char> local_189;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string strMatFallbackName;
  allocator<char> local_e1;
  string local_e0;
  IOStream *local_c0;
  IOStream *pFile;
  string local_b0 [8];
  string path;
  undefined1 local_88 [8];
  string absName;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string strMatName;
  char *pStart;
  ObjFileParser *this_local;
  
  _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var4._M_current;
  bVar2 = __gnu_cxx::operator==(&this->m_DataIt,&this->m_DataItEnd);
  if (bVar2) {
    return;
  }
  strMatName.field_2._8_8_ =
       __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator*
                 (&this->m_DataIt);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&this->m_DataIt,&this->m_DataItEnd);
    local_a29 = 0;
    if (bVar2) {
      pcVar5 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&this->m_DataIt);
      bVar2 = IsLineEnd<char>(*pcVar5);
      local_a29 = bVar2 ^ 0xff;
    }
    __beg = strMatName.field_2._8_8_;
    if ((local_a29 & 1) == 0) break;
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&this->m_DataIt);
  }
  pcVar5 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
           operator*(&this->m_DataIt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>((string *)local_50,(char *)__beg,pcVar5,&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::string::string((string *)local_88);
  lVar6 = std::__cxx11::string::length();
  if (lVar6 == 0) {
    pLVar7 = DefaultLogger::get();
    Logger::warn(pLVar7,"OBJ: no name for material library specified.");
    path.field_2._12_4_ = 1;
  }
  else {
    iVar3 = (*this->m_pIO->_vptr_IOSystem[9])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      std::__cxx11::string::operator=((string *)local_88,(string *)local_50);
    }
    else {
      iVar3 = (*this->m_pIO->_vptr_IOSystem[8])();
      std::__cxx11::string::string(local_b0,(string *)CONCAT44(extraout_var_00,iVar3));
      std::__cxx11::string::rbegin();
      pcVar8 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&pFile);
      if (*pcVar8 != '/') {
        std::__cxx11::string::operator+=(local_b0,'/');
      }
      std::__cxx11::string::operator+=((string *)local_88,local_b0);
      std::__cxx11::string::operator+=((string *)local_88,(string *)local_50);
      std::__cxx11::string::~string(local_b0);
    }
    pIVar1 = this->m_pIO;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"rb",&local_e1);
    pIVar9 = IOSystem::Open(pIVar1,(string *)local_88,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    local_c0 = pIVar9;
    if (pIVar9 == (IOStream *)0x0) {
      pLVar7 = DefaultLogger::get();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&strMatFallbackName.field_2 + 8),"OBJ: Unable to locate material file ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      Logger::error(pLVar7,(string *)((long)&strMatFallbackName.field_2 + 8));
      std::__cxx11::string::~string((string *)(strMatFallbackName.field_2._M_local_buf + 8));
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_148,(ulong)&this->m_originalObjFileName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     &local_148,"mtl");
      std::__cxx11::string::~string((string *)&local_148);
      pLVar7 = DefaultLogger::get();
      std::operator+(&local_168,"OBJ: Opening fallback material file ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128)
      ;
      Logger::info(pLVar7,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      pIVar1 = this->m_pIO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"rb",&local_189);
      local_c0 = IOSystem::Open(pIVar1,(string *)local_128,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
      path.field_2._M_local_buf[0xc] = local_c0 == (IOStream *)0x0;
      if ((bool)path.field_2._M_local_buf[0xc]) {
        pLVar7 = DefaultLogger::get();
        std::operator+(&local_1b0,"OBJ: Unable to locate fallback material file ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128);
        Logger::error(pLVar7,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        _Var4 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,
                           &this->m_uiLine);
        (this->m_DataIt)._M_current = _Var4._M_current;
      }
      path.field_2._13_3_ = 0;
      std::__cxx11::string::~string((string *)local_128);
      if (path.field_2._12_4_ != 0) goto LAB_0059b96c;
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(mtlImporter.m_buffer + 0x7fc));
    BaseImporter::TextFileToBuffer
              (local_c0,(vector<char,_std::allocator<char>_> *)(mtlImporter.m_buffer + 0x7fc),
               ALLOW_EMPTY);
    (*this->m_pIO->_vptr_IOSystem[5])(this->m_pIO,local_c0);
    pModel = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             get(&this->m_pModel);
    ObjFileMtlImporter::ObjFileMtlImporter
              ((ObjFileMtlImporter *)local_a20,
               (vector<char,_std::allocator<char>_> *)(mtlImporter.m_buffer + 0x7fc),
               (string *)local_50,pModel);
    ObjFileMtlImporter::~ObjFileMtlImporter((ObjFileMtlImporter *)local_a20);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)(mtlImporter.m_buffer + 0x7fc));
    path.field_2._12_4_ = 0;
  }
LAB_0059b96c:
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void ObjFileParser::getMaterialLib() {
    // Translate tuple
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }

    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsLineEnd( *m_DataIt ) ) {
        ++m_DataIt;
    }

    // Check for existence
    const std::string strMatName(pStart, &(*m_DataIt));
    std::string absName;

	// Check if directive is valid.
    if ( 0 == strMatName.length() ) {
        ASSIMP_LOG_WARN( "OBJ: no name for material library specified." );
        return;
    }

    if ( m_pIO->StackSize() > 0 ) {
        std::string path = m_pIO->CurrentDirectory();
        if ( '/' != *path.rbegin() ) {
          path += '/';
        }
        absName += path;
        absName += strMatName;
    } else {
        absName = strMatName;
    }

    IOStream *pFile = m_pIO->Open( absName );
    if ( nullptr == pFile ) {
        ASSIMP_LOG_ERROR("OBJ: Unable to locate material file " + strMatName);
        std::string strMatFallbackName = m_originalObjFileName.substr(0, m_originalObjFileName.length() - 3) + "mtl";
        ASSIMP_LOG_INFO("OBJ: Opening fallback material file " + strMatFallbackName);
        pFile = m_pIO->Open(strMatFallbackName);
        if (!pFile) {
            ASSIMP_LOG_ERROR("OBJ: Unable to locate fallback material file " + strMatFallbackName);
            m_DataIt = skipLine<DataArrayIt>(m_DataIt, m_DataItEnd, m_uiLine);
            return;
        }
    }

    // Import material library data from file.
    // Some exporters (e.g. Silo) will happily write out empty
    // material files if the model doesn't use any materials, so we
    // allow that.
    std::vector<char> buffer;
    BaseImporter::TextFileToBuffer( pFile, buffer, BaseImporter::ALLOW_EMPTY );
    m_pIO->Close( pFile );

    // Importing the material library
    ObjFileMtlImporter mtlImporter( buffer, strMatName, m_pModel.get() );
}